

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O2

ConcatNDLayerParams *
google::protobuf::internal::
down_cast<CoreML::Specification::ConcatNDLayerParams_const*,google::protobuf::MessageLite_const>
          (MessageLite *f)

{
  if ((f != (MessageLite *)0x0) &&
     (f->_vptr_MessageLite != (_func_int **)&PTR__ConcatNDLayerParams_003ff368)) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::ConcatNDLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  return (ConcatNDLayerParams *)f;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}